

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  allocator<char> local_89;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fnameSessions;
  Session session;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  printf("Usage: %s session0.imdd [session1.imdd] [session2.imdd] [...]\n",*argv);
  if (argc < 2) {
    iVar2 = -1;
  }
  else {
    fnameSessions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    fnameSessions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    fnameSessions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (uVar3 = 1; (uint)argc != uVar3; uVar3 = uVar3 + 1) {
      printf("[+] Session \'%s\' info:\n",argv[uVar3]);
      session.frames.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      session.frames.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      session.frames.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar1 = Session::load(&session,argv[uVar3]);
      if (bVar1) {
        Session::printInfo(&session);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,argv[uVar3],&local_89);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &fnameSessions,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      else {
        fwrite("    [E] Failed reading the file. Probably not an ImDrawData session file?\n",0x4a,1,
               _stderr);
      }
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::~vector(&session.frames);
    }
    putchar(10);
    if (fnameSessions.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        fnameSessions.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      fwrite("[E] No valid files provided - nothing to do\n",0x2c,1,_stderr);
      iVar2 = -1;
    }
    else {
      ImGui::DebugCheckVersionAndDataLayout("1.88 WIP",0x37d0,0x418,8,0x10,0x14,2);
      ImGui::CreateContext((ImFontAtlas *)0x0);
      benchmark<ImDrawDataCompressor::XorRlePerDrawList>(&fnameSessions);
      benchmark<ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset>(&fnameSessions);
      iVar2 = 0;
      ImGui::DestroyContext((ImGuiContext *)0x0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&fnameSessions);
  }
  return iVar2;
}

Assistant:

int main(int argc , char ** argv) {
    printf("Usage: %s session0.imdd [session1.imdd] [session2.imdd] [...]\n", argv[0]);

    if (argc < 2) {
        return -1;
    }

    std::vector<std::string> fnameSessions;

    for (int i = 1; i < argc; ++i) {
        printf("[+] Session '%s' info:\n", argv[i]);
        Session session;
        if (session.load(argv[i]) == false) {
            fprintf(stderr, "    [E] Failed reading the file. Probably not an ImDrawData session file?\n");
        } else {
            session.printInfo();
            fnameSessions.push_back(argv[i]);
        }
    }
    printf("\n");

    if (fnameSessions.size() == 0) {
        fprintf(stderr, "[E] No valid files provided - nothing to do\n");
        return -1;
    }

    IMGUI_CHECKVERSION();
    ImGui::CreateContext();

    benchmark<ImDrawDataCompressor::XorRlePerDrawList>(fnameSessions);
    benchmark<ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset>(fnameSessions);

    ImGui::DestroyContext();

    return 0;
}